

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

repeat_at_least *
toml::detail::syntax::unquoted_key(repeat_at_least *__return_storage_ptr__,spec *s)

{
  either keychar;
  alpha local_78;
  character local_50;
  character local_40;
  digit local_30;
  
  alpha::alpha(&local_78,s);
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004db830;
  local_30.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004daa00;
  local_30.scanner_.from_ = '0';
  local_30.scanner_.to_ = '9';
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004da940;
  local_40.value_ = '-';
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004da940;
  local_50.value_ = '_';
  either::
  either<toml::detail::syntax::alpha,toml::detail::syntax::digit,toml::detail::character,toml::detail::character>
            (&keychar,&local_78,&local_30,&local_40,&local_50);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78.scanner_.others_);
  if (s->v1_1_0_allow_non_english_in_bare_keys == true) {
    local_78.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004dac68;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::syntax::non_ascii_key_char>
              (&keychar.others_,(non_ascii_key_char *)&local_78);
  }
  repeat_at_least::repeat_at_least<toml::detail::either>(__return_storage_ptr__,1,&keychar);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&keychar.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE repeat_at_least unquoted_key(const spec& s)
{
    auto keychar = either(
            alpha(s), digit(s), character{0x2D}, character{0x5F}
        );

    if(s.v1_1_0_allow_non_english_in_bare_keys)
    {
        keychar.push_back(non_ascii_key_char(s));
    }

    return repeat_at_least(1, std::move(keychar));
}